

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O0

void __thiscall
chrono::curiosity::CuriosityPart::CuriosityPart
          (CuriosityPart *this,string *name,ChFrame<double> *rel_pos,
          shared_ptr<chrono::ChMaterialSurface> *mat,bool collide)

{
  ChQuaternion<double> local_b0;
  ChVector<double> local_90;
  ChQuaternion<double> local_78;
  ChVector<double> local_48;
  byte local_29;
  shared_ptr<chrono::ChMaterialSurface> *psStack_28;
  bool collide_local;
  shared_ptr<chrono::ChMaterialSurface> *mat_local;
  ChFrame<double> *rel_pos_local;
  string *name_local;
  CuriosityPart *this_local;
  
  this->_vptr_CuriosityPart = (_func_int **)&PTR__CuriosityPart_002ee878;
  local_29 = collide;
  psStack_28 = mat;
  mat_local = (shared_ptr<chrono::ChMaterialSurface> *)rel_pos;
  rel_pos_local = (ChFrame<double> *)name;
  name_local = (string *)this;
  std::__cxx11::string::string((string *)&this->m_name,(string *)name);
  std::shared_ptr<chrono::ChBodyAuxRef>::shared_ptr(&this->m_body);
  std::shared_ptr<chrono::ChMaterialSurface>::shared_ptr(&this->m_mat,mat);
  std::__cxx11::string::string((string *)&this->m_mesh_name);
  ChVector<double>::ChVector(&local_48,0.0,0.0,0.0);
  ChQuaternion<double>::ChQuaternion(&local_78,1.0,0.0,0.0,0.0);
  ChFrame<double>::ChFrame(&this->m_mesh_xform,&local_48,&local_78);
  ChColor::ChColor(&this->m_color);
  ChFrame<double>::ChFrame(&this->m_pos,(ChFrame<double> *)mat_local);
  ChVector<double>::ChVector(&this->m_inertia);
  ChVector<double>::ChVector(&local_90,0.0,0.0,0.0);
  ChQuaternion<double>::ChQuaternion(&local_b0,1.0,0.0,0.0,0.0);
  ChFrame<double>::ChFrame(&this->m_cog,&local_90,&local_b0);
  this->m_visualize = true;
  this->m_collide = (bool)(local_29 & 1);
  return;
}

Assistant:

CuriosityPart::CuriosityPart(const std::string& name,
                             const ChFrame<>& rel_pos,
                             std::shared_ptr<ChMaterialSurface> mat,
                             bool collide)
    : m_name(name), m_pos(rel_pos), m_mat(mat), m_collide(collide), m_visualize(true) {}